

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O1

void * INT_CMCondition_get_client_data(CManager cm,int condition)

{
  void *pvVar1;
  CMCondition p_Var2;
  
  p_Var2 = (CMCondition)&cm->control_list->condition_list;
  set_debug_flag(cm);
  do {
    p_Var2 = p_Var2->next;
    if (p_Var2 == (CMCondition)0x0) {
      p_Var2 = (CMCondition)0x0;
      fprintf(_stderr,"Serious internal error.  Use of condition %d, no longer in control list\n",
              condition);
      break;
    }
  } while (p_Var2->condition_num != condition);
  if (p_Var2 == (CMCondition)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = p_Var2->client_data;
  }
  return pvVar1;
}

Assistant:

extern void *
INT_CMCondition_get_client_data(CManager cm, int condition)
{
    CMCondition cond;
    void *client_data;
    CMControlList cl = cm->control_list;
    set_debug_flag(cm);
    cond = CMCondition_find(cl, condition);
    if (cond) {
	client_data = cond->client_data;
	return client_data;
    } else {
	return NULL;
    }
}